

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FName,_FIntermissionDescriptor_*,_THashTraits<FName>,_TValueTraits<FIntermissionDescriptor_*>_>
::GetNode(TMap<FName,_FIntermissionDescriptor_*,_THashTraits<FName>,_TValueTraits<FIntermissionDescriptor_*>_>
          *this,FName *key)

{
  Node *pNVar1;
  FName local_18;
  FName local_14;
  
  local_14 = (FName)key->Index;
  pNVar1 = FindKey(this,&local_14);
  if (pNVar1 == (Node *)0x0) {
    _local_18 = CONCAT44(local_14.Index,key->Index);
    pNVar1 = NewKey(this,&local_18);
  }
  return pNVar1;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}